

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim_sse2.c
# Opt level: O2

uint32_t AccumulateSSE_SSE2(uint8_t *src1,uint8_t *src2,int len)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  long lVar33;
  uint32_t uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  int iVar41;
  int iVar42;
  __m128i b_a;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  
  if (len < 0x10) {
    uVar34 = 0;
    lVar33 = 0;
  }
  else {
    lVar33 = 0x10;
    iVar37 = 0;
    iVar41 = 0;
    iVar42 = 0;
    iVar43 = 0;
    while( true ) {
      auVar35 = psubusb(*(undefined1 (*) [16])(src1 + lVar33 + -0x10),
                        *(undefined1 (*) [16])(src2 + lVar33 + -0x10));
      auVar38 = psubusb(*(undefined1 (*) [16])(src2 + lVar33 + -0x10),
                        *(undefined1 (*) [16])(src1 + lVar33 + -0x10));
      if (len + -0x20 < lVar33) break;
      pauVar1 = (undefined1 (*) [16])(src1 + lVar33);
      pauVar2 = (undefined1 (*) [16])(src2 + lVar33);
      auVar35 = auVar35 | auVar38;
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar35._0_13_;
      auVar3[0xe] = auVar35[7];
      auVar6[0xc] = auVar35[6];
      auVar6._0_12_ = auVar35._0_12_;
      auVar6._13_2_ = auVar3._13_2_;
      auVar9[0xb] = 0;
      auVar9._0_11_ = auVar35._0_11_;
      auVar9._12_3_ = auVar6._12_3_;
      auVar12[10] = auVar35[5];
      auVar12._0_10_ = auVar35._0_10_;
      auVar12._11_4_ = auVar9._11_4_;
      auVar15[9] = 0;
      auVar15._0_9_ = auVar35._0_9_;
      auVar15._10_5_ = auVar12._10_5_;
      auVar18[8] = auVar35[4];
      auVar18._0_8_ = auVar35._0_8_;
      auVar18._9_6_ = auVar15._9_6_;
      auVar24._7_8_ = 0;
      auVar24._0_7_ = auVar18._8_7_;
      auVar27._1_8_ = SUB158(auVar24 << 0x40,7);
      auVar27[0] = auVar35[3];
      auVar27._9_6_ = 0;
      auVar28._1_10_ = SUB1510(auVar27 << 0x30,5);
      auVar28[0] = auVar35[2];
      auVar28._11_4_ = 0;
      auVar21[2] = auVar35[1];
      auVar21._0_2_ = auVar35._0_2_;
      auVar21._3_12_ = SUB1512(auVar28 << 0x20,3);
      auVar39._0_2_ = auVar35._0_2_ & 0xff;
      auVar39._2_13_ = auVar21._2_13_;
      auVar39[0xf] = 0;
      auVar45[1] = 0;
      auVar45[0] = auVar35[8];
      auVar45[2] = auVar35[9];
      auVar45[3] = 0;
      auVar45[4] = auVar35[10];
      auVar45[5] = 0;
      auVar45[6] = auVar35[0xb];
      auVar45[7] = 0;
      auVar45[8] = auVar35[0xc];
      auVar45[9] = 0;
      auVar45[10] = auVar35[0xd];
      auVar45[0xb] = 0;
      auVar45[0xc] = auVar35[0xe];
      auVar45[0xd] = 0;
      auVar45[0xe] = auVar35[0xf];
      auVar45[0xf] = 0;
      auVar40 = pmaddwd(auVar39,auVar39);
      auVar35 = pmaddwd(auVar45,auVar45);
      lVar33 = lVar33 + 0x20;
      auVar45 = psubusb(*pauVar1,*pauVar2);
      auVar38 = psubusb(*pauVar2,*pauVar1);
      auVar38 = auVar38 | auVar45;
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar38._0_13_;
      auVar4[0xe] = auVar38[7];
      auVar7[0xc] = auVar38[6];
      auVar7._0_12_ = auVar38._0_12_;
      auVar7._13_2_ = auVar4._13_2_;
      auVar10[0xb] = 0;
      auVar10._0_11_ = auVar38._0_11_;
      auVar10._12_3_ = auVar7._12_3_;
      auVar13[10] = auVar38[5];
      auVar13._0_10_ = auVar38._0_10_;
      auVar13._11_4_ = auVar10._11_4_;
      auVar16[9] = 0;
      auVar16._0_9_ = auVar38._0_9_;
      auVar16._10_5_ = auVar13._10_5_;
      auVar19[8] = auVar38[4];
      auVar19._0_8_ = auVar38._0_8_;
      auVar19._9_6_ = auVar16._9_6_;
      auVar25._7_8_ = 0;
      auVar25._0_7_ = auVar19._8_7_;
      auVar29._1_8_ = SUB158(auVar25 << 0x40,7);
      auVar29[0] = auVar38[3];
      auVar29._9_6_ = 0;
      auVar30._1_10_ = SUB1510(auVar29 << 0x30,5);
      auVar30[0] = auVar38[2];
      auVar30._11_4_ = 0;
      auVar22[2] = auVar38[1];
      auVar22._0_2_ = auVar38._0_2_;
      auVar22._3_12_ = SUB1512(auVar30 << 0x20,3);
      auVar44._0_2_ = auVar38._0_2_ & 0xff;
      auVar44._2_13_ = auVar22._2_13_;
      auVar44[0xf] = 0;
      auVar36[1] = 0;
      auVar36[0] = auVar38[8];
      auVar36[2] = auVar38[9];
      auVar36[3] = 0;
      auVar36[4] = auVar38[10];
      auVar36[5] = 0;
      auVar36[6] = auVar38[0xb];
      auVar36[7] = 0;
      auVar36[8] = auVar38[0xc];
      auVar36[9] = 0;
      auVar36[10] = auVar38[0xd];
      auVar36[0xb] = 0;
      auVar36[0xc] = auVar38[0xe];
      auVar36[0xd] = 0;
      auVar36[0xe] = auVar38[0xf];
      auVar36[0xf] = 0;
      auVar45 = pmaddwd(auVar44,auVar44);
      auVar38 = pmaddwd(auVar36,auVar36);
      iVar37 = auVar40._0_4_ + iVar37 + auVar45._0_4_ + auVar35._0_4_ + auVar38._0_4_;
      iVar41 = auVar40._4_4_ + iVar41 + auVar45._4_4_ + auVar35._4_4_ + auVar38._4_4_;
      iVar42 = auVar40._8_4_ + iVar42 + auVar45._8_4_ + auVar35._8_4_ + auVar38._8_4_;
      iVar43 = auVar40._12_4_ + iVar43 + auVar45._12_4_ + auVar35._12_4_ + auVar38._12_4_;
    }
    auVar35 = auVar35 | auVar38;
    auVar5[0xd] = 0;
    auVar5._0_13_ = auVar35._0_13_;
    auVar5[0xe] = auVar35[7];
    auVar8[0xc] = auVar35[6];
    auVar8._0_12_ = auVar35._0_12_;
    auVar8._13_2_ = auVar5._13_2_;
    auVar11[0xb] = 0;
    auVar11._0_11_ = auVar35._0_11_;
    auVar11._12_3_ = auVar8._12_3_;
    auVar14[10] = auVar35[5];
    auVar14._0_10_ = auVar35._0_10_;
    auVar14._11_4_ = auVar11._11_4_;
    auVar17[9] = 0;
    auVar17._0_9_ = auVar35._0_9_;
    auVar17._10_5_ = auVar14._10_5_;
    auVar20[8] = auVar35[4];
    auVar20._0_8_ = auVar35._0_8_;
    auVar20._9_6_ = auVar17._9_6_;
    auVar26._7_8_ = 0;
    auVar26._0_7_ = auVar20._8_7_;
    auVar31._1_8_ = SUB158(auVar26 << 0x40,7);
    auVar31[0] = auVar35[3];
    auVar31._9_6_ = 0;
    auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
    auVar32[0] = auVar35[2];
    auVar32._11_4_ = 0;
    auVar23[2] = auVar35[1];
    auVar23._0_2_ = auVar35._0_2_;
    auVar23._3_12_ = SUB1512(auVar32 << 0x20,3);
    auVar40._0_2_ = auVar35._0_2_ & 0xff;
    auVar40._2_13_ = auVar23._2_13_;
    auVar40[0xf] = 0;
    auVar38[1] = 0;
    auVar38[0] = auVar35[8];
    auVar38[2] = auVar35[9];
    auVar38[3] = 0;
    auVar38[4] = auVar35[10];
    auVar38[5] = 0;
    auVar38[6] = auVar35[0xb];
    auVar38[7] = 0;
    auVar38[8] = auVar35[0xc];
    auVar38[9] = 0;
    auVar38[10] = auVar35[0xd];
    auVar38[0xb] = 0;
    auVar38[0xc] = auVar35[0xe];
    auVar38[0xd] = 0;
    auVar38[0xe] = auVar35[0xf];
    auVar38[0xf] = 0;
    auVar40 = pmaddwd(auVar40,auVar40);
    auVar35 = pmaddwd(auVar38,auVar38);
    uVar34 = auVar40._12_4_ + iVar43 + auVar35._12_4_ + auVar40._4_4_ + iVar41 + auVar35._4_4_ +
             auVar40._8_4_ + iVar42 + auVar35._8_4_ + auVar40._0_4_ + iVar37 + auVar35._0_4_;
  }
  for (; lVar33 < len; lVar33 = lVar33 + 1) {
    uVar34 = uVar34 + ((uint)src1[lVar33] - (uint)src2[lVar33]) *
                      ((uint)src1[lVar33] - (uint)src2[lVar33]);
  }
  return uVar34;
}

Assistant:

static uint32_t AccumulateSSE_SSE2(const uint8_t* src1,
                                   const uint8_t* src2, int len) {
  int i = 0;
  uint32_t sse2 = 0;
  if (len >= 16) {
    const int limit = len - 32;
    int32_t tmp[4];
    __m128i sum1;
    __m128i sum = _mm_setzero_si128();
    __m128i a0 = _mm_loadu_si128((const __m128i*)&src1[i]);
    __m128i b0 = _mm_loadu_si128((const __m128i*)&src2[i]);
    i += 16;
    while (i <= limit) {
      const __m128i a1 = _mm_loadu_si128((const __m128i*)&src1[i]);
      const __m128i b1 = _mm_loadu_si128((const __m128i*)&src2[i]);
      __m128i sum2;
      i += 16;
      SubtractAndSquare_SSE2(a0, b0, &sum1);
      sum = _mm_add_epi32(sum, sum1);
      a0 = _mm_loadu_si128((const __m128i*)&src1[i]);
      b0 = _mm_loadu_si128((const __m128i*)&src2[i]);
      i += 16;
      SubtractAndSquare_SSE2(a1, b1, &sum2);
      sum = _mm_add_epi32(sum, sum2);
    }
    SubtractAndSquare_SSE2(a0, b0, &sum1);
    sum = _mm_add_epi32(sum, sum1);
    _mm_storeu_si128((__m128i*)tmp, sum);
    sse2 += (tmp[3] + tmp[2] + tmp[1] + tmp[0]);
  }

  for (; i < len; ++i) {
    const int32_t diff = src1[i] - src2[i];
    sse2 += diff * diff;
  }
  return sse2;
}